

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall E64::stats_t::process_parameters(stats_t *this)

{
  uint8_t uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  uVar1 = this->framecounter + '\x01';
  this->framecounter = uVar1;
  if (uVar1 == this->framecounter_interval) {
    this->framecounter = '\0';
    uVar2 = sdl2_get_queued_audio_size();
    this->audio_queue_size = (double)uVar2;
    dVar3 = this->alpha;
    dVar4 = 1.0 - dVar3;
    this->smoothed_audio_queue_size =
         this->smoothed_audio_queue_size * dVar3 + (double)uVar2 * dVar4;
    dVar5 = (double)((uint)this->framecounter_interval * 1000000) / (double)this->total_time;
    this->framerate = dVar5;
    this->smoothed_framerate = this->smoothed_framerate * dVar3 + dVar4 * dVar5;
    dVar5 = (dVar5 * 198000.0) / 1000000.0;
    this->mhz = dVar5;
    this->smoothed_mhz = this->smoothed_mhz * dVar3 + dVar5 * dVar4;
    dVar5 = (double)(this->total_idle_time / (long)(ulong)this->framecounter_interval);
    this->idle_per_frame = dVar5;
    this->smoothed_idle_per_frame = dVar3 * this->smoothed_idle_per_frame + dVar4 * dVar5;
    dVar3 = blitter_ic::fraction_busy(machine.blitter);
    this->percentage_blitter = dVar3;
    this->smoothed_percentage_blitter =
         this->alpha * this->smoothed_percentage_blitter + (1.0 - this->alpha) * 100.0 * dVar3;
    this->total_time = 0;
    this->total_idle_time = 0;
  }
  uVar1 = this->status_bar_framecounter + '\x01';
  this->status_bar_framecounter = uVar1;
  if (uVar1 == this->status_bar_framecounter_interval) {
    snprintf(this->statistics_string,0x100,"%5.2fMHz  %5.2ffps  %5.2fms %4.1fkb %5.1f%% blit",
             this->smoothed_mhz,this->smoothed_framerate,this->smoothed_idle_per_frame / 1000.0,
             this->smoothed_audio_queue_size * 0.0009765625,this->smoothed_percentage_blitter);
    this->status_bar_framecounter = '\0';
  }
  return;
}

Assistant:

void E64::stats_t::process_parameters()
{
    framecounter++;
    if(framecounter == framecounter_interval)
    {
        framecounter = 0;
        
        audio_queue_size = E64::sdl2_get_queued_audio_size();
        smoothed_audio_queue_size = (alpha * smoothed_audio_queue_size) + ((1.0 - alpha) * audio_queue_size);

        // framerate is no. of frames in one measurement interval divided by the duration
        framerate = (double)(framecounter_interval * 1000000) / total_time;
        smoothed_framerate = (alpha * smoothed_framerate) + ((1.0 - alpha) * framerate);

        mhz = (double)(framerate * (CPU_CLOCK_SPEED / FPS) )/1000000;
        smoothed_mhz = (alpha * smoothed_mhz) + ((1.0 - alpha) * mhz);
        
        idle_per_frame = total_idle_time / (framecounter_interval);
        smoothed_idle_per_frame = (alpha * smoothed_idle_per_frame) + ((1.0 - alpha) * idle_per_frame);
        
        percentage_blitter = machine.blitter->fraction_busy();
        smoothed_percentage_blitter = (alpha * smoothed_percentage_blitter) + (100.0 * (1.0 - alpha) * percentage_blitter);
        
        total_time = total_idle_time = 0;
    }

    status_bar_framecounter++;
    if( status_bar_framecounter == status_bar_framecounter_interval )
    {
        snprintf(statistics_string, 256, "%5.2fMHz  %5.2ffps  %5.2fms %4.1fkb %5.1f%% blit", smoothed_mhz, smoothed_framerate, smoothed_idle_per_frame/1000, smoothed_audio_queue_size/1024, smoothed_percentage_blitter);
        status_bar_framecounter = 0;
    }
}